

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall DepthShader::fragment(DepthShader *this,Model *model,vec3f bar,TGAColor *color)

{
  TGAColor TVar1;
  TGAColor local_42 [2];
  undefined1 local_38 [8];
  vec3f p;
  TGAColor *color_local;
  Model *model_local;
  DepthShader *this_local;
  
  p.z = (double)color;
  operator*((vec<3UL,_double> *)local_38,&this->varying_tri,&bar);
  TGAColor::TGAColor(local_42,0xff,0xff,0xff,0xff);
  TVar1 = TGAColor::operator*(local_42,p.y / 500.0);
  *(uint8_t (*) [4])p.z = TVar1.bgra;
  *(uint8_t *)((long)p.z + 4) = TVar1.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f p = varying_tri * bar;
        color = TGAColor(255, 255, 255) * (p.z / 500.f);
        return false;
    }